

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QArgumentType>::emplace_back_impl<QArgumentType>
          (QVLABase<QArgumentType> *this,qsizetype prealloc,void *array,QArgumentType *args)

{
  qsizetype *pqVar1;
  void *pvVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  long lVar6;
  long aalloc;
  
  lVar6 = (this->super_QVLABaseBase).s;
  if (lVar6 == (this->super_QVLABaseBase).a) {
    aalloc = lVar6 + 1;
    if (lVar6 + 1 < lVar6 * 2) {
      aalloc = lVar6 * 2;
    }
    reallocate_impl(this,prealloc,array,lVar6,aalloc);
    lVar6 = (this->super_QVLABaseBase).s;
  }
  pvVar2 = (this->super_QVLABaseBase).ptr;
  lVar6 = lVar6 * 0x20;
  *(QMetaTypeInterface **)((long)pvVar2 + lVar6) = (args->_metaType).d_ptr;
  pDVar3 = (args->_name).d.d;
  (args->_name).d.d = (Data *)0x0;
  *(Data **)((long)pvVar2 + lVar6 + 8) = pDVar3;
  pcVar4 = (args->_name).d.ptr;
  (args->_name).d.ptr = (char *)0x0;
  *(char **)((long)pvVar2 + lVar6 + 0x10) = pcVar4;
  qVar5 = (args->_name).d.size;
  (args->_name).d.size = 0;
  *(qsizetype *)((long)pvVar2 + lVar6 + 0x18) = qVar5;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return (reference)((long)pvVar2 + lVar6);
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }